

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O1

bool __thiscall GlobOpt::DoFieldCopyProp(GlobOpt *this)

{
  BasicBlock *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Loop *loop;
  
  this_00 = this->currentBlock;
  if ((this->field_0xf4 & 0x20) == 0) {
    loop = this_00->loop;
  }
  else {
    bVar2 = BasicBlock::IsLandingPad(this_00);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x12,"(block->IsLandingPad())","block->IsLandingPad()");
      if (!bVar2) goto LAB_004a0000;
      *puVar3 = 0;
    }
    loop = this_00->next->loop;
    if (loop == (Loop *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x14,"(loop)","loop");
      if (!bVar2) {
LAB_004a0000:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      loop = (Loop *)0x0;
    }
  }
  bVar2 = DoFieldCopyProp(this,loop);
  return bVar2;
}

Assistant:

bool
GlobOpt::DoFieldCopyProp() const
{
    BasicBlock *block = this->currentBlock;
    Loop *loop = block->loop;
    if (this->isRecursiveCallOnLandingPad)
    {
        // The landing pad at this point only contains load hosted by PRE.
        // These need to be copy-prop'd into the loop.
        // We want to look at the implicit-call info of the loop, not it's parent.

        Assert(block->IsLandingPad());
        loop = block->next->loop;
        Assert(loop);
    }

    return DoFieldCopyProp(loop);
}